

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merkle_tests.cpp
# Opt level: O1

void __thiscall merkle_tests::merkle_test::test_method(merkle_test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer puVar2;
  _func_int ***ppp_Var3;
  undefined8 *puVar4;
  uchar *puVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar6;
  ushort uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  void *pvVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  char *pcVar14;
  char *pcVar15;
  pointer puVar16;
  int iVar17;
  uint uVar18;
  uint64_t uVar19;
  undefined8 *puVar20;
  char *pcVar21;
  byte bVar22;
  uint uVar23;
  uint uVar24;
  int iVar25;
  iterator pvVar26;
  ulong uVar27;
  uint uVar28;
  uint uVar29;
  FastRandomContext *this_01;
  ulong uVar30;
  ulong uVar31;
  pointer psVar32;
  element_type *peVar33;
  uint256 *puVar34;
  uchar *puVar35;
  uint uVar36;
  long lVar37;
  ulong uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  iterator pvVar42;
  iterator pvVar43;
  uint uVar44;
  int iVar45;
  uint uVar46;
  uint uVar47;
  long lVar48;
  uint uVar49;
  iterator pvVar50;
  long in_FS_OFFSET;
  bool bVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  const_string file;
  Span<unsigned_char> output;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  Span<unsigned_char> output_00;
  Span<unsigned_char> output_01;
  Span<unsigned_char> output_02;
  const_string file_05;
  const_string file_06;
  Span<unsigned_char> output_03;
  Span<unsigned_char> output_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  bool newMutated;
  vector<uint256,_std::allocator<uint256>_> merkleTree;
  bool unmutatedMutated;
  uint256 newRoot;
  uint256 oldRoot;
  uint256 unmutatedRoot;
  CBlock block;
  vector<uint256,_std::allocator<uint256>_> oldBranch;
  uint256 h;
  CMutableTransaction mtx;
  uint256 result;
  check_type cVar66;
  char *local_798;
  char *local_790;
  undefined1 *local_788;
  undefined1 *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  undefined1 *local_758;
  undefined1 *local_750;
  char *local_748;
  char *local_740;
  undefined1 local_738 [16];
  uint256 *local_728;
  char *local_720;
  char *local_718;
  undefined1 *local_710;
  undefined1 *local_708;
  char *local_700;
  char *local_6f8;
  char *local_6f0;
  char *local_6e8;
  undefined1 *local_6e0;
  undefined1 *local_6d8;
  char *local_6d0;
  char *local_6c8;
  char *local_6c0;
  char *local_6b8;
  undefined1 *local_6b0;
  undefined1 *local_6a8;
  char *local_6a0;
  char *local_698;
  char *local_690;
  char *local_688;
  undefined1 *local_680;
  undefined1 *local_678;
  char *local_670;
  char *local_668;
  char *local_660;
  char *local_658;
  undefined1 *local_650;
  undefined1 *local_648;
  char *local_640;
  char *local_638;
  bool local_629;
  vector<uint256,_std::allocator<uint256>_> local_628;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  bool local_5d9;
  assertion_result local_5d8;
  uint256 local_5b8;
  undefined8 local_598;
  undefined8 uStack_590;
  undefined1 local_588 [16];
  uint256 local_578;
  undefined1 local_558 [16];
  undefined1 local_548 [16];
  undefined1 local_538 [16];
  undefined1 local_528 [16];
  undefined1 local_518 [16];
  undefined1 local_508 [16];
  pointer local_4f8;
  undefined3 uStack_4f0;
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  undefined1 local_4c8 [8];
  undefined1 auStack_4c0 [8];
  shared_count asStack_4b8 [2];
  undefined1 local_4a8 [16];
  undefined1 local_498 [8];
  undefined1 auStack_490 [24];
  undefined1 local_478 [16];
  undefined1 local_468 [16];
  undefined1 local_458 [16];
  uint64_t local_448;
  undefined1 local_a8 [8];
  bool abStack_a0 [8];
  shared_count local_98;
  undefined1 *puStack_90;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  uint64_t local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_ChainTestingSetup.
             super_BasicTestingSetup.m_rng;
  uVar36 = 0;
  do {
    uVar44 = uVar36;
    if (0x10 < uVar36) {
      do {
        uVar19 = RandomMixin<FastRandomContext>::randbits
                           (&this_01->super_RandomMixin<FastRandomContext>,0xc);
      } while (3999 < uVar19);
      uVar44 = (int)uVar19 + 0x11;
    }
    uVar28 = uVar44 - 1;
    uVar23 = 0x10;
    if ((int)uVar44 < 0x10) {
      uVar23 = uVar44;
    }
    if (uVar28 == 0) {
      uVar24 = 0x20;
    }
    else {
      uVar24 = 0x1f;
      if (uVar28 != 0) {
        for (; uVar28 >> uVar24 == 0; uVar24 = uVar24 - 1) {
        }
      }
      uVar24 = uVar24 ^ 0x1f;
    }
    uVar39 = 0;
    do {
      uVar49 = 0;
      if (uVar39 != 0) {
        bVar22 = 0;
        if (uVar44 != 0 && (uVar44 & 1) == 0) {
          bVar22 = 0;
          uVar27 = (ulong)uVar44;
          do {
            bVar22 = bVar22 + 1;
            uVar30 = uVar27 & 2;
            uVar27 = uVar27 >> 1;
          } while (uVar30 == 0);
        }
        uVar49 = 1 << (bVar22 & 0x1f);
      }
      if ((int)uVar44 <= (int)uVar49) break;
      uVar40 = uVar49 + uVar44;
      pvVar43 = (iterator)0x0;
      if (1 < uVar39) {
        bVar22 = 0;
        if ((uVar40 & 1) == 0 && uVar40 != 0) {
          bVar22 = 0;
          uVar27 = (ulong)uVar40;
          do {
            bVar22 = bVar22 + 1;
            uVar30 = uVar27 & 2;
            uVar27 = uVar27 >> 1;
          } while (uVar30 == 0);
        }
        pvVar43 = (iterator)(ulong)(uint)(1 << (bVar22 & 0x1f));
      }
      iVar17 = (int)pvVar43;
      if ((int)uVar40 <= iVar17) break;
      uVar41 = iVar17 + uVar40;
      pvVar42 = (iterator)(ulong)uVar41;
      uVar27 = 0;
      if (uVar39 == 3) {
        bVar22 = 0;
        if ((uVar41 & 1) == 0 && uVar41 != 0) {
          bVar22 = 0;
          pvVar26 = pvVar42;
          do {
            bVar22 = bVar22 + 1;
            uVar27 = (ulong)pvVar26 & 2;
            pvVar26 = (iterator)((ulong)pvVar26 >> 1);
          } while (uVar27 == 0);
        }
        uVar27 = (ulong)(uint)(1 << (bVar22 & 0x1f));
      }
      iVar45 = (int)uVar27;
      if ((int)uVar41 <= iVar45) break;
      local_4f8 = (pointer)0x0;
      local_508 = (undefined1  [16])0x0;
      local_518 = (undefined1  [16])0x0;
      local_528 = (undefined1  [16])0x0;
      local_538 = (undefined1  [16])0x0;
      local_548 = (undefined1  [16])0x0;
      local_558 = (undefined1  [16])0x0;
      uStack_4f0._0_1_ = false;
      uStack_4f0._1_1_ = false;
      uStack_4f0._2_1_ = false;
      pvVar26 = pvVar43;
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::resize((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)local_508,(long)(int)uVar44);
      if (0 < (int)uVar44) {
        lVar37 = 8;
        uVar30 = 0;
        do {
          CMutableTransaction::CMutableTransaction((CMutableTransaction *)local_4a8);
          local_478._4_4_ = (uint32_t)uVar30;
          local_a8[0] = (class_property<bool>)0x0;
          local_a8._1_7_ = 0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)abStack_a0,
                     (CTransaction **)local_a8,(allocator<CTransaction> *)local_4c8,
                     (CMutableTransaction *)local_4a8);
          uVar8 = CONCAT71(local_a8._1_7_,local_a8[0]);
          uVar9 = CONCAT71(abStack_a0._1_7_,abStack_a0[0]);
          local_a8[0] = (class_property<bool>)0x0;
          local_a8._1_7_ = 0;
          abStack_a0[0] = false;
          abStack_a0[1] = false;
          abStack_a0[2] = false;
          abStack_a0[3] = false;
          abStack_a0[4] = false;
          abStack_a0[5] = false;
          abStack_a0[6] = false;
          abStack_a0[7] = false;
          this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                     ((long)&((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                             local_508._0_8_)->_M_ptr + lVar37);
          puVar4 = (undefined8 *)(local_508._0_8_ + lVar37 + -8);
          *puVar4 = uVar8;
          puVar4[1] = uVar9;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              CONCAT71(abStack_a0._1_7_,abStack_a0[0]) !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       CONCAT71(abStack_a0._1_7_,abStack_a0[0]));
          }
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)(local_498 + 8));
          std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                    ((vector<CTxIn,_std::allocator<CTxIn>_> *)local_4a8);
          uVar30 = uVar30 + 1;
          lVar37 = lVar37 + 0x10;
        } while (uVar44 != uVar30);
      }
      local_5d9 = false;
      BlockMerkleRoot(&local_578,(CBlock *)local_558,&local_5d9);
      local_5f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_5e8 = "";
      local_600 = &boost::unit_test::basic_cstring<char_const>::null;
      local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
      file.m_end = &DAT_000000d2;
      file.m_begin = (iterator)&local_5f0;
      msg.m_end = pvVar26;
      msg.m_begin = pvVar42;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_600,msg)
      ;
      local_a8[0] = (class_property<bool>)(local_5d9 ^ 1);
      abStack_a0[0] = false;
      abStack_a0[1] = false;
      abStack_a0[2] = false;
      abStack_a0[3] = false;
      abStack_a0[4] = false;
      abStack_a0[5] = false;
      abStack_a0[6] = false;
      abStack_a0[7] = false;
      local_98.pi_ = (sp_counted_base *)0x0;
      local_4c8 = (undefined1  [8])0xecda38;
      auStack_4c0 = (undefined1  [8])"";
      local_4a8[8] = 0;
      local_4a8._0_8_ = &PTR__lazy_ostream_013d3df0;
      auStack_490._0_8_ = local_4c8;
      local_498 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
      local_610 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_608 = "";
      pvVar42 = (iterator)0x1;
      pvVar26 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_a8,(lazy_ostream *)local_4a8,1,0,WARN,_cVar66,
                 (size_t)&local_610,0xd2);
      boost::detail::shared_count::~shared_count(&local_98);
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::resize((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)local_508,(long)(int)(uVar41 + iVar45));
      if (0 < (int)uVar49) {
        uVar31 = (ulong)uVar49;
        uVar30 = uVar31;
        uVar38 = (long)(int)uVar44 << 4 | 8;
        do {
          p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                           local_508._0_8_)->_M_ptr + uVar38);
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_508._0_8_ + (uVar38 - 8)) =
               p_Var1[uVar31 * -2 + -1]._M_pi;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(p_Var1,p_Var1 + uVar31 * -2);
          uVar38 = uVar38 + 0x10;
          uVar30 = uVar30 - 1;
        } while (uVar30 != 0);
      }
      if (0 < iVar17) {
        uVar30 = (long)(int)uVar40 << 4 | 8;
        pvVar50 = pvVar43;
        do {
          p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                           local_508._0_8_)->_M_ptr + uVar30);
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_508._0_8_ + (uVar30 - 8)) =
               p_Var1[(long)pvVar43 * -2 + -1]._M_pi;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (p_Var1,p_Var1 + (long)pvVar43 * -2);
          uVar30 = uVar30 + 0x10;
          pvVar50 = pvVar50 + -1;
        } while (pvVar50 != (iterator)0x0);
      }
      if (0 < iVar45) {
        uVar38 = (long)(int)uVar41 << 4 | 8;
        uVar30 = uVar27;
        do {
          p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                           local_508._0_8_)->_M_ptr + uVar38);
          *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_508._0_8_ + (uVar38 - 8)) =
               p_Var1[uVar27 * -2 + -1]._M_pi;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(p_Var1,p_Var1 + uVar27 * -2);
          uVar38 = uVar38 + 0x10;
          uVar30 = uVar30 - 1;
        } while (uVar30 != 0);
      }
      local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint256 *)0x0;
      local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      std::vector<uint256,_std::allocator<uint256>_>::reserve
                (&local_628,((long)(local_508._8_8_ - local_508._0_8_) >> 3) + 0x10);
      psVar32 = (pointer)local_508._0_8_;
      if (local_508._0_8_ != local_508._8_8_) {
        do {
          peVar6 = (psVar32->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                   _M_ptr;
          if (local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<uint256,std::allocator<uint256>>::_M_realloc_insert<uint256_const&>
                      ((vector<uint256,std::allocator<uint256>> *)&local_628,
                       (iterator)
                       local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_finish,&(peVar6->hash).m_wrapped);
          }
          else {
            uVar8 = *(undefined8 *)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
            uVar9 = *(undefined8 *)
                     ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8);
            uVar10 = *(undefined8 *)
                      ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
            *(undefined8 *)
             (((local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 0x10) =
                 *(undefined8 *)
                  ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10);
            *(undefined8 *)
             (((local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 0x18) =
                 uVar10;
            *(undefined8 *)
             ((local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
               super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems = uVar8;
            *(undefined8 *)
             (((local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 8) =
                 uVar9;
            local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          psVar32 = psVar32 + 1;
        } while (psVar32 != (pointer)local_508._8_8_);
      }
      uVar27 = (ulong)(local_508._8_8_ - local_508._0_8_) >> 4;
      uVar30 = 0;
      if (1 < (int)uVar27) {
        bVar22 = 0;
        do {
          uVar49 = (uint)uVar27;
          iVar17 = uVar49 - 1;
          lVar48 = uVar30 << 5;
          lVar37 = 0;
          do {
            iVar45 = (int)lVar37 + 1;
            if (iVar17 < iVar45) {
              iVar45 = iVar17;
            }
            puVar16 = local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_start;
            iVar25 = (int)uVar30;
            if (iVar45 + 1U == uVar49 && lVar37 < iVar17) {
              puVar35 = ((local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems
                        + lVar48;
              puVar5 = ((local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                         super__Vector_impl_data._M_start)->super_base_blob<256U>).m_data._M_elems +
                       lVar48 + 0x10;
              puVar2 = local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_start + (iVar25 + iVar45);
              auVar62[0] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0] == *puVar35);
              auVar62[1] = -((puVar2->super_base_blob<256U>).m_data._M_elems[1] == puVar35[1]);
              auVar62[2] = -((puVar2->super_base_blob<256U>).m_data._M_elems[2] == puVar35[2]);
              auVar62[3] = -((puVar2->super_base_blob<256U>).m_data._M_elems[3] == puVar35[3]);
              auVar62[4] = -((puVar2->super_base_blob<256U>).m_data._M_elems[4] == puVar35[4]);
              auVar62[5] = -((puVar2->super_base_blob<256U>).m_data._M_elems[5] == puVar35[5]);
              auVar62[6] = -((puVar2->super_base_blob<256U>).m_data._M_elems[6] == puVar35[6]);
              auVar62[7] = -((puVar2->super_base_blob<256U>).m_data._M_elems[7] == puVar35[7]);
              auVar62[8] = -((puVar2->super_base_blob<256U>).m_data._M_elems[8] == puVar35[8]);
              auVar62[9] = -((puVar2->super_base_blob<256U>).m_data._M_elems[9] == puVar35[9]);
              auVar62[10] = -((puVar2->super_base_blob<256U>).m_data._M_elems[10] == puVar35[10]);
              auVar62[0xb] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xb] == puVar35[0xb])
              ;
              auVar62[0xc] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xc] == puVar35[0xc])
              ;
              auVar62[0xd] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xd] == puVar35[0xd])
              ;
              auVar62[0xe] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xe] == puVar35[0xe])
              ;
              auVar62[0xf] = -((puVar2->super_base_blob<256U>).m_data._M_elems[0xf] == puVar35[0xf])
              ;
              puVar35 = local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar25 + iVar45].super_base_blob<256U>.
                        m_data._M_elems + 0x10;
              auVar52[0] = -(*puVar35 == *puVar5);
              auVar52[1] = -(puVar35[1] == puVar5[1]);
              auVar52[2] = -(puVar35[2] == puVar5[2]);
              auVar52[3] = -(puVar35[3] == puVar5[3]);
              auVar52[4] = -(puVar35[4] == puVar5[4]);
              auVar52[5] = -(puVar35[5] == puVar5[5]);
              auVar52[6] = -(puVar35[6] == puVar5[6]);
              auVar52[7] = -(puVar35[7] == puVar5[7]);
              auVar52[8] = -(puVar35[8] == puVar5[8]);
              auVar52[9] = -(puVar35[9] == puVar5[9]);
              auVar52[10] = -(puVar35[10] == puVar5[10]);
              auVar52[0xb] = -(puVar35[0xb] == puVar5[0xb]);
              auVar52[0xc] = -(puVar35[0xc] == puVar5[0xc]);
              auVar52[0xd] = -(puVar35[0xd] == puVar5[0xd]);
              auVar52[0xe] = -(puVar35[0xe] == puVar5[0xe]);
              auVar52[0xf] = -(puVar35[0xf] == puVar5[0xf]);
              auVar52 = auVar52 & auVar62;
              if ((ushort)((ushort)(SUB161(auVar52 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar52 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar52 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar52 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar52 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar52 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar52 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar52 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar52 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar52 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar52 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar52 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar52 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar52 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar52 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar52[0xf] >> 7) << 0xf) == 0xffff) {
                bVar22 = 1;
              }
            }
            local_a8[0] = (class_property<bool>)0x0;
            local_a8._1_7_ = 0;
            abStack_a0[0] = false;
            abStack_a0[1] = false;
            abStack_a0[2] = false;
            abStack_a0[3] = false;
            abStack_a0[4] = false;
            abStack_a0[5] = false;
            abStack_a0[6] = false;
            abStack_a0[7] = false;
            local_98.pi_ = (sp_counted_base *)0x0;
            puStack_90 = (undefined1 *)0x0;
            local_458 = (undefined1  [16])0x0;
            local_468 = (undefined1  [16])0x0;
            local_478 = (undefined1  [16])0x0;
            auStack_490._8_16_ = (undefined1  [16])0x0;
            _local_498 = (undefined1  [16])0x0;
            local_4a8._0_8_ = (_func_int **)0x0;
            local_4a8[8] = false;
            local_4a8._9_7_ = 0;
            local_448 = 0;
            CSHA256::CSHA256((CSHA256 *)local_4a8);
            CSHA256::Write((CSHA256 *)local_4a8,
                           (puVar16->super_base_blob<256U>).m_data._M_elems + lVar48,0x20);
            CSHA256::Write((CSHA256 *)local_4a8,(uchar *)(puVar16 + (iVar45 + iVar25)),0x20);
            output.m_size = 0x20;
            output.m_data = local_a8;
            CHash256::Finalize((CHash256 *)local_4a8,output);
            if (local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<uint256,_std::allocator<uint256>_>::_M_realloc_insert<uint256>
                        (&local_628,
                         (iterator)
                         local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                         super__Vector_impl_data._M_finish,(uint256 *)local_a8);
            }
            else {
              *(sp_counted_base **)
               (((local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 0x10)
                   = local_98.pi_;
              *(undefined1 **)
               (((local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                  super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems + 0x18)
                   = puStack_90;
              *(ulong *)((local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                          super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data._M_elems
                   = CONCAT71(local_a8._1_7_,local_a8[0]);
              *(ulong *)(((local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                           super__Vector_impl_data._M_finish)->super_base_blob<256U>).m_data.
                         _M_elems + 8) = CONCAT71(abStack_a0._1_7_,abStack_a0[0]);
              local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            lVar37 = lVar37 + 2;
            lVar48 = lVar48 + 0x40;
          } while ((int)lVar37 < (int)uVar49);
          uVar30 = (ulong)(iVar25 + uVar49);
          uVar27 = (ulong)(uVar49 + 1 >> 1);
        } while (2 < uVar49);
        uVar30 = (ulong)bVar22;
      }
      if (local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start ==
          local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_598 = 0;
        uStack_590 = 0;
        local_588 = (undefined1  [16])0x0;
      }
      else {
        local_598 = *(undefined8 *)
                     local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems;
        uStack_590 = *(undefined8 *)
                      (local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                       super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems +
                      8);
        local_588 = *(undefined1 (*) [16])
                     (local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                      super__Vector_impl_data._M_finish[-1].super_base_blob<256U>.m_data._M_elems +
                     0x10);
      }
      local_629 = false;
      BlockMerkleRoot(&local_5b8,(CBlock *)local_558,&local_629);
      local_640 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_638 = "";
      local_650 = &boost::unit_test::basic_cstring<char_const>::null;
      local_648 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0xe5;
      file_00.m_begin = (iterator)&local_640;
      msg_00.m_end = pvVar26;
      msg_00.m_begin = pvVar42;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_650,
                 msg_00);
      auVar58[0] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x10] == local_588[0]);
      auVar58[1] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x11] == local_588[1]);
      auVar58[2] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x12] == local_588[2]);
      auVar58[3] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x13] == local_588[3]);
      auVar58[4] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x14] == local_588[4]);
      auVar58[5] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x15] == local_588[5]);
      auVar58[6] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x16] == local_588[6]);
      auVar58[7] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x17] == local_588[7]);
      auVar58[8] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x18] == local_588[8]);
      auVar58[9] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x19] == local_588[9]);
      auVar58[10] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x1a] == local_588[10]);
      auVar58[0xb] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x1b] == local_588[0xb]);
      auVar58[0xc] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x1c] == local_588[0xc]);
      auVar58[0xd] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x1d] == local_588[0xd]);
      auVar58[0xe] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x1e] == local_588[0xe]);
      auVar58[0xf] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0x1f] == local_588[0xf]);
      auVar53[0] = -((class_property<bool>)local_5b8.super_base_blob<256U>.m_data._M_elems[0] ==
                    local_598._0_1_);
      auVar53[1] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[1] == local_598._1_1_);
      auVar53[2] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[2] == local_598._2_1_);
      auVar53[3] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[3] == local_598._3_1_);
      auVar53[4] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[4] == local_598._4_1_);
      auVar53[5] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[5] == local_598._5_1_);
      auVar53[6] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[6] == local_598._6_1_);
      auVar53[7] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[7] == local_598._7_1_);
      auVar53[8] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[8] == (uchar)uStack_590);
      auVar53[9] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[9] == uStack_590._1_1_);
      auVar53[10] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[10] == uStack_590._2_1_);
      auVar53[0xb] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0xb] == uStack_590._3_1_);
      auVar53[0xc] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0xc] == uStack_590._4_1_);
      auVar53[0xd] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0xd] == uStack_590._5_1_);
      auVar53[0xe] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0xe] == uStack_590._6_1_);
      auVar53[0xf] = -(local_5b8.super_base_blob<256U>.m_data._M_elems[0xf] == uStack_590._7_1_);
      auVar53 = auVar53 & auVar58;
      local_a8[0] = (class_property<bool>)
                    ((ushort)((ushort)(SUB161(auVar53 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar53 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar53 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar53 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar53 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar53 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar53 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar53 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar53 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar53 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar53 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar53 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar53 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar53 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar53 >> 0x77,0) & 1) << 0xe |
                             (ushort)(byte)(auVar53[0xf] >> 7) << 0xf) == 0xffff);
      abStack_a0[0] = false;
      abStack_a0[1] = false;
      abStack_a0[2] = false;
      abStack_a0[3] = false;
      abStack_a0[4] = false;
      abStack_a0[5] = false;
      abStack_a0[6] = false;
      abStack_a0[7] = false;
      local_98.pi_ = (sp_counted_base *)0x0;
      local_4c8 = (undefined1  [8])0xecda52;
      auStack_4c0 = (undefined1  [8])0xecda64;
      local_4a8[8] = 0;
      local_4a8._0_8_ = &PTR__lazy_ostream_013d3df0;
      auStack_490._0_8_ = local_4c8;
      local_498 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
      local_660 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_658 = "";
      pvVar43 = (iterator)0x1;
      pvVar42 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_a8,(lazy_ostream *)local_4a8,1,0,WARN,_cVar66,
                 (size_t)&local_660,0xe5);
      boost::detail::shared_count::~shared_count(&local_98);
      local_670 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_668 = "";
      local_680 = &boost::unit_test::basic_cstring<char_const>::null;
      local_678 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0xe6;
      file_01.m_begin = (iterator)&local_670;
      msg_01.m_end = pvVar42;
      msg_01.m_begin = pvVar43;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_680,
                 msg_01);
      auVar63[0] = -(local_578.super_base_blob<256U>.m_data._M_elems[0] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[0]);
      auVar63[1] = -(local_578.super_base_blob<256U>.m_data._M_elems[1] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[1]);
      auVar63[2] = -(local_578.super_base_blob<256U>.m_data._M_elems[2] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[2]);
      auVar63[3] = -(local_578.super_base_blob<256U>.m_data._M_elems[3] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[3]);
      auVar63[4] = -(local_578.super_base_blob<256U>.m_data._M_elems[4] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[4]);
      auVar63[5] = -(local_578.super_base_blob<256U>.m_data._M_elems[5] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[5]);
      auVar63[6] = -(local_578.super_base_blob<256U>.m_data._M_elems[6] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[6]);
      auVar63[7] = -(local_578.super_base_blob<256U>.m_data._M_elems[7] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[7]);
      auVar63[8] = -(local_578.super_base_blob<256U>.m_data._M_elems[8] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[8]);
      auVar63[9] = -(local_578.super_base_blob<256U>.m_data._M_elems[9] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[9]);
      auVar63[10] = -(local_578.super_base_blob<256U>.m_data._M_elems[10] ==
                     local_5b8.super_base_blob<256U>.m_data._M_elems[10]);
      auVar63[0xb] = -(local_578.super_base_blob<256U>.m_data._M_elems[0xb] ==
                      local_5b8.super_base_blob<256U>.m_data._M_elems[0xb]);
      auVar63[0xc] = -(local_578.super_base_blob<256U>.m_data._M_elems[0xc] ==
                      local_5b8.super_base_blob<256U>.m_data._M_elems[0xc]);
      auVar63[0xd] = -(local_578.super_base_blob<256U>.m_data._M_elems[0xd] ==
                      local_5b8.super_base_blob<256U>.m_data._M_elems[0xd]);
      auVar63[0xe] = -(local_578.super_base_blob<256U>.m_data._M_elems[0xe] ==
                      local_5b8.super_base_blob<256U>.m_data._M_elems[0xe]);
      auVar63[0xf] = -(local_578.super_base_blob<256U>.m_data._M_elems[0xf] ==
                      local_5b8.super_base_blob<256U>.m_data._M_elems[0xf]);
      auVar54[0] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x10] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[0x10]);
      auVar54[1] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x11] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[0x11]);
      auVar54[2] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x12] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[0x12]);
      auVar54[3] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x13] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[0x13]);
      auVar54[4] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x14] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[0x14]);
      auVar54[5] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x15] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[0x15]);
      auVar54[6] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x16] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[0x16]);
      auVar54[7] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x17] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[0x17]);
      auVar54[8] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x18] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[0x18]);
      auVar54[9] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x19] ==
                    local_5b8.super_base_blob<256U>.m_data._M_elems[0x19]);
      auVar54[10] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x1a] ==
                     local_5b8.super_base_blob<256U>.m_data._M_elems[0x1a]);
      auVar54[0xb] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x1b] ==
                      local_5b8.super_base_blob<256U>.m_data._M_elems[0x1b]);
      auVar54[0xc] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x1c] ==
                      local_5b8.super_base_blob<256U>.m_data._M_elems[0x1c]);
      auVar54[0xd] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x1d] ==
                      local_5b8.super_base_blob<256U>.m_data._M_elems[0x1d]);
      auVar54[0xe] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x1e] ==
                      local_5b8.super_base_blob<256U>.m_data._M_elems[0x1e]);
      auVar54[0xf] = -(local_578.super_base_blob<256U>.m_data._M_elems[0x1f] ==
                      local_5b8.super_base_blob<256U>.m_data._M_elems[0x1f]);
      auVar54 = auVar54 & auVar63;
      local_a8[0] = (class_property<bool>)
                    ((ushort)((ushort)(SUB161(auVar54 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar54 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar54 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar54 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar54 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar54 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar54 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar54 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar54 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar54 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar54 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar54 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar54 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar54 >> 0x6f,0) & 1) << 0xd |
                              (ushort)(SUB161(auVar54 >> 0x77,0) & 1) << 0xe |
                             (ushort)(byte)(auVar54[0xf] >> 7) << 0xf) == 0xffff);
      abStack_a0[0] = false;
      abStack_a0[1] = false;
      abStack_a0[2] = false;
      abStack_a0[3] = false;
      abStack_a0[4] = false;
      abStack_a0[5] = false;
      abStack_a0[6] = false;
      abStack_a0[7] = false;
      local_98.pi_ = (sp_counted_base *)0x0;
      local_4c8 = (undefined1  [8])0xecda65;
      auStack_4c0 = (undefined1  [8])"";
      local_4a8[8] = 0;
      local_4a8._0_8_ = &PTR__lazy_ostream_013d3df0;
      auStack_490._0_8_ = local_4c8;
      local_498 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
      local_690 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_688 = "";
      pvVar43 = (iterator)0x1;
      pvVar42 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_a8,(lazy_ostream *)local_4a8,1,0,WARN,_cVar66,
                 (size_t)&local_690,0xe6);
      boost::detail::shared_count::~shared_count(&local_98);
      local_6a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_698 = "";
      local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0xe7;
      file_02.m_begin = (iterator)&local_6a0;
      msg_02.m_end = pvVar42;
      msg_02.m_begin = pvVar43;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_6b0,
                 msg_02);
      _local_498 = (undefined1  [16])0x0;
      local_4a8._0_8_ = (_func_int **)0x0;
      local_4a8[8] = false;
      local_4a8._9_7_ = 0;
      auVar12[1] = local_5b8.super_base_blob<256U>.m_data._M_elems[1];
      auVar12[0] = local_5b8.super_base_blob<256U>.m_data._M_elems[0];
      auVar12[2] = local_5b8.super_base_blob<256U>.m_data._M_elems[2];
      auVar12[3] = local_5b8.super_base_blob<256U>.m_data._M_elems[3];
      auVar12[4] = local_5b8.super_base_blob<256U>.m_data._M_elems[4];
      auVar12[5] = local_5b8.super_base_blob<256U>.m_data._M_elems[5];
      auVar12[6] = local_5b8.super_base_blob<256U>.m_data._M_elems[6];
      auVar12[7] = local_5b8.super_base_blob<256U>.m_data._M_elems[7];
      auVar12[8] = local_5b8.super_base_blob<256U>.m_data._M_elems[8];
      auVar12[9] = local_5b8.super_base_blob<256U>.m_data._M_elems[9];
      auVar12[10] = local_5b8.super_base_blob<256U>.m_data._M_elems[10];
      auVar12[0xb] = local_5b8.super_base_blob<256U>.m_data._M_elems[0xb];
      auVar12[0xc] = local_5b8.super_base_blob<256U>.m_data._M_elems[0xc];
      auVar12[0xd] = local_5b8.super_base_blob<256U>.m_data._M_elems[0xd];
      auVar12[0xe] = local_5b8.super_base_blob<256U>.m_data._M_elems[0xe];
      auVar12[0xf] = local_5b8.super_base_blob<256U>.m_data._M_elems[0xf];
      auVar59[1] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x11];
      auVar59[0] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x10];
      auVar59[2] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x12];
      auVar59[3] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x13];
      auVar59[4] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x14];
      auVar59[5] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x15];
      auVar59[6] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x16];
      auVar59[7] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x17];
      auVar59[8] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x18];
      auVar59[9] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x19];
      auVar59[10] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x1a];
      auVar59[0xb] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x1b];
      auVar59[0xc] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x1c];
      auVar59[0xd] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x1d];
      auVar59[0xe] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x1e];
      auVar59[0xf] = local_5b8.super_base_blob<256U>.m_data._M_elems[0x1f];
      auVar59 = auVar59 | auVar12;
      auVar60[0] = -(auVar59[0] == '\0');
      auVar60[1] = -(auVar59[1] == '\0');
      auVar60[2] = -(auVar59[2] == '\0');
      auVar60[3] = -(auVar59[3] == '\0');
      auVar60[4] = -(auVar59[4] == '\0');
      auVar60[5] = -(auVar59[5] == '\0');
      auVar60[6] = -(auVar59[6] == '\0');
      auVar60[7] = -(auVar59[7] == '\0');
      auVar60[8] = -(auVar59[8] == '\0');
      auVar60[9] = -(auVar59[9] == '\0');
      auVar60[10] = -(auVar59[10] == '\0');
      auVar60[0xb] = -(auVar59[0xb] == '\0');
      auVar60[0xc] = -(auVar59[0xc] == '\0');
      auVar60[0xd] = -(auVar59[0xd] == '\0');
      auVar60[0xe] = -(auVar59[0xe] == '\0');
      auVar60[0xf] = -(auVar59[0xf] == '\0');
      local_4c8[0] = (readonly_property<bool>)
                     (readonly_property<bool>)
                     (((ushort)((ushort)(SUB161(auVar60 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar60 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar60 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar60 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar60 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar60 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar60 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar60 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar60 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar60 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar60 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar60 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar60 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar60 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar60 >> 0x77,0) & 1) << 0xe |
                               (ushort)(auVar60[0xf] >> 7) << 0xf) == 0xffff) != (uVar44 != 0));
      _auStack_4c0 = (undefined1  [16])0x0;
      local_4e8._8_8_ = "";
      local_4e8._0_8_ = "(newRoot == uint256()) == (ntx == 0)";
      abStack_a0[0] = false;
      local_a8[0] = (class_property<bool>)0xf0;
      local_a8._1_7_ = 0x13d3d;
      local_98.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      puStack_90 = local_4e8;
      local_6c0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_6b8 = "";
      pvVar43 = (iterator)0x1;
      pvVar42 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_4c8,(lazy_ostream *)local_a8,1,0,WARN,_cVar66,
                 (size_t)&local_6c0,0xe7);
      boost::detail::shared_count::~shared_count((shared_count *)(auStack_4c0 + 8));
      local_6d0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_6c8 = "";
      local_6e0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_6d8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0xe8;
      file_03.m_begin = (iterator)&local_6d0;
      msg_03.m_end = pvVar42;
      msg_03.m_begin = pvVar43;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_6e0,
                 msg_03);
      local_a8[0] = (class_property<bool>)(SUB81(uVar30,0) == local_629);
      abStack_a0[0] = false;
      abStack_a0[1] = false;
      abStack_a0[2] = false;
      abStack_a0[3] = false;
      abStack_a0[4] = false;
      abStack_a0[5] = false;
      abStack_a0[6] = false;
      abStack_a0[7] = false;
      local_98.pi_ = (sp_counted_base *)0x0;
      local_4c8 = (undefined1  [8])0xecdaa3;
      auStack_4c0 = (undefined1  [8])0xecdabb;
      local_4a8[8] = 0;
      local_4a8._0_8_ = &PTR__lazy_ostream_013d3df0;
      auStack_490._0_8_ = local_4c8;
      local_498 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
      local_6f0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_6e8 = "";
      pvVar43 = (iterator)0x1;
      pvVar42 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_a8,(lazy_ostream *)local_4a8,1,0,WARN,_cVar66,
                 (size_t)&local_6f0,0xe8);
      boost::detail::shared_count::~shared_count(&local_98);
      local_700 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_6f8 = "";
      local_710 = &boost::unit_test::basic_cstring<char_const>::null;
      local_708 = &boost::unit_test::basic_cstring<char_const>::null;
      file_04.m_end = (iterator)0xe9;
      file_04.m_begin = (iterator)&local_700;
      msg_04.m_end = pvVar42;
      msg_04.m_begin = pvVar43;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_710,
                 msg_04);
      local_a8[0] = (class_property<bool>)(local_629 == (uVar39 != 0));
      abStack_a0[0] = false;
      abStack_a0[1] = false;
      abStack_a0[2] = false;
      abStack_a0[3] = false;
      abStack_a0[4] = false;
      abStack_a0[5] = false;
      abStack_a0[6] = false;
      abStack_a0[7] = false;
      local_98.pi_ = (sp_counted_base *)0x0;
      local_4c8 = (undefined1  [8])0xecdabc;
      auStack_4c0 = (undefined1  [8])"";
      local_4a8[8] = 0;
      local_4a8._0_8_ = &PTR__lazy_ostream_013d3df0;
      auStack_490._0_8_ = local_4c8;
      local_498 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
      local_720 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
      ;
      local_718 = "";
      pvVar43 = (iterator)0x1;
      pvVar42 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_a8,(lazy_ostream *)local_4a8,1,0,WARN,_cVar66,
                 (size_t)&local_720,0xe9);
      boost::detail::shared_count::~shared_count(&local_98);
      if ((uVar39 == 0) && (0 < (int)uVar44)) {
        uVar49 = 0;
        do {
          uVar40 = uVar49;
          if (0x10 < (int)uVar44) {
            do {
              uVar19 = RandomMixin<FastRandomContext>::randbits
                                 (&this_01->super_RandomMixin<FastRandomContext>,0x20 - uVar24);
              uVar40 = (uint)uVar19;
            } while (uVar28 < uVar19);
          }
          local_5d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)(class_property<bool>)0x0;
          local_5d8._1_7_ = 0;
          local_5d8.m_message.px = (element_type *)0x0;
          local_5d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
          std::vector<uint256,_std::allocator<uint256>_>::resize
                    ((vector<uint256,_std::allocator<uint256>_> *)&local_5d8,
                     (long)(local_508._8_8_ - local_508._0_8_) >> 4);
          if (local_508._8_8_ != local_508._0_8_) {
            lVar37 = 0;
            uVar27 = 0;
            do {
              lVar48 = *(long *)((long)&((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>
                                          *)local_508._0_8_)->_M_ptr + lVar37);
              uVar8 = *(undefined8 *)(lVar48 + 0x39);
              uVar9 = *(undefined8 *)(lVar48 + 0x41);
              uVar10 = *(undefined8 *)(lVar48 + 0x51);
              puVar4 = (undefined8 *)
                       (CONCAT71(local_5d8._1_7_,
                                 local_5d8.p_predicate_value.super_readonly_property<bool>.
                                 super_class_property<bool>.value) + 0x10 + lVar37 * 2);
              *puVar4 = *(undefined8 *)(lVar48 + 0x49);
              puVar4[1] = uVar10;
              puVar4 = (undefined8 *)
                       (CONCAT71(local_5d8._1_7_,
                                 local_5d8.p_predicate_value.super_readonly_property<bool>.
                                 super_class_property<bool>.value) + lVar37 * 2);
              *puVar4 = uVar8;
              puVar4[1] = uVar9;
              uVar27 = uVar27 + 1;
              lVar37 = lVar37 + 0x10;
            } while (uVar27 < (ulong)((long)(local_508._8_8_ - local_508._0_8_) >> 4));
          }
          local_728 = (uint256 *)0x0;
          local_738 = (undefined1  [16])0x0;
          peVar33 = (element_type *)
                    CONCAT71(local_5d8._1_7_,
                             local_5d8.p_predicate_value.super_readonly_property<bool>.
                             super_class_property<bool>.value);
          if (local_5d8.m_message.px != peVar33) {
            uVar27 = 0;
            memset(local_4a8,0,0x400);
            uVar41 = 0xffffffff;
            uVar47 = 0;
            do {
              ppp_Var3 = &(peVar33->m_stream).super_basic_ostream<char,_std::char_traits<char>_>.
                          _vptr_basic_ostream + uVar27 * 4;
              local_4c8 = (undefined1  [8])*ppp_Var3;
              auStack_4c0 = (undefined1  [8])ppp_Var3[1];
              puVar4 = (undefined8 *)
                       (&(peVar33->m_stream).super_basic_ostream<char,_std::char_traits<char>_>.
                         field_0x10 + uVar27 * 0x20);
              asStack_4b8[0].pi_ = (sp_counted_base *)*puVar4;
              asStack_4b8[1].pi_ = (sp_counted_base *)puVar4[1];
              bVar51 = uVar47 == uVar40;
              uVar18 = uVar47 + 1;
              uVar27 = (ulong)uVar18;
              uVar30 = 0;
              if ((uVar47 & 1) != 0) {
                bVar51 = uVar47 == uVar40;
                puVar34 = (uint256 *)local_4a8;
                uVar30 = 0;
                do {
                  if (bVar51) {
                    if ((uint256 *)local_738._8_8_ == local_728) {
                      std::vector<uint256,std::allocator<uint256>>::
                      _M_realloc_insert<uint256_const&>
                                ((vector<uint256,std::allocator<uint256>> *)local_738,
                                 (iterator)local_738._8_8_,puVar34);
                    }
                    else {
                      uVar8 = *(undefined8 *)(puVar34->super_base_blob<256U>).m_data._M_elems;
                      uVar9 = *(undefined8 *)((puVar34->super_base_blob<256U>).m_data._M_elems + 8);
                      uVar10 = *(undefined8 *)
                                ((puVar34->super_base_blob<256U>).m_data._M_elems + 0x18);
                      *(undefined8 *)
                       ((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 0x10) =
                           *(undefined8 *)((puVar34->super_base_blob<256U>).m_data._M_elems + 0x10);
                      *(undefined8 *)
                       ((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 0x18) = uVar10;
                      *(undefined8 *)(((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems = uVar8
                      ;
                      *(undefined8 *)((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 8) =
                           uVar9;
LAB_0043e065:
                      local_738._8_8_ = (uint256 *)(local_738._8_8_ + 0x20);
                    }
                  }
                  else if (uVar41 == uVar30) {
                    if ((uint256 *)local_738._8_8_ != local_728) {
                      *(sp_counted_base **)
                       ((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 0x10) =
                           asStack_4b8[0].pi_;
                      *(sp_counted_base **)
                       ((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 0x18) =
                           asStack_4b8[1].pi_;
                      *(undefined1 (*) [8])(((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems =
                           local_4c8;
                      *(undefined1 (*) [8])
                       ((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 8) = auStack_4c0;
                      bVar51 = true;
                      goto LAB_0043e065;
                    }
                    bVar51 = true;
                    std::vector<uint256,std::allocator<uint256>>::_M_realloc_insert<uint256_const&>
                              ((vector<uint256,std::allocator<uint256>> *)local_738,
                               (iterator)local_738._8_8_,(uint256 *)local_4c8);
                  }
                  local_4d8 = (undefined1  [16])0x0;
                  local_4e8 = (undefined1  [16])0x0;
                  local_58 = (undefined1  [16])0x0;
                  local_68 = (undefined1  [16])0x0;
                  local_78 = (undefined1  [16])0x0;
                  local_88 = (undefined1  [16])0x0;
                  local_98.pi_ = (sp_counted_base *)0x0;
                  puStack_90 = (undefined1 *)0x0;
                  local_a8[0] = (class_property<bool>)0x0;
                  local_a8._1_7_ = 0;
                  abStack_a0[0] = false;
                  abStack_a0[1] = false;
                  abStack_a0[2] = false;
                  abStack_a0[3] = false;
                  abStack_a0[4] = false;
                  abStack_a0[5] = false;
                  abStack_a0[6] = false;
                  abStack_a0[7] = false;
                  local_48 = 0;
                  CSHA256::CSHA256((CSHA256 *)local_a8);
                  CSHA256::Write((CSHA256 *)local_a8,(uchar *)puVar34,0x20);
                  CSHA256::Write((CSHA256 *)local_a8,local_4c8,0x20);
                  output_00.m_size = 0x20;
                  output_00.m_data = local_4e8;
                  CHash256::Finalize((CHash256 *)local_a8,output_00);
                  local_4c8 = (undefined1  [8])local_4e8._0_8_;
                  auStack_4c0 = (undefined1  [8])local_4e8._8_8_;
                  asStack_4b8[0].pi_ = (sp_counted_base *)local_4d8._0_8_;
                  asStack_4b8[1].pi_ = (sp_counted_base *)local_4d8._8_8_;
                  bVar22 = (byte)uVar30;
                  uVar30 = uVar30 + 1;
                  puVar34 = puVar34 + 1;
                } while ((uVar18 >> (bVar22 & 0x1f) & 2) == 0);
              }
              lVar37 = (uVar30 & 0xffffffff) * 0x20;
              *(sp_counted_base **)(local_498 + lVar37) = asStack_4b8[0].pi_;
              *(sp_counted_base **)(local_498 + lVar37 + 8) = asStack_4b8[1].pi_;
              if (bVar51) {
                uVar41 = (uint)uVar30;
              }
              *(undefined1 (*) [8])(local_4a8 + lVar37) = local_4c8;
              *(undefined1 (*) [8])(local_4a8 + lVar37 + 8) = auStack_4c0;
              peVar33 = (element_type *)
                        CONCAT71(local_5d8._1_7_,
                                 local_5d8.p_predicate_value.super_readonly_property<bool>.
                                 super_class_property<bool>.value);
              uVar47 = uVar18;
            } while (uVar27 < (ulong)((long)local_5d8.m_message.px - (long)peVar33 >> 5));
            uVar47 = 0xffffffff;
            puVar4 = (undefined8 *)local_4c8;
            do {
              puVar20 = puVar4;
              uVar47 = uVar47 + 1;
              uVar29 = 1 << ((byte)uVar47 & 0x1f);
              puVar4 = puVar20 + 4;
            } while ((uVar18 >> (uVar47 & 0x1f) & 1) == 0);
            local_4c8 = (undefined1  [8])puVar20[4];
            _auStack_4c0 = *(undefined1 (*) [16])(puVar20 + 5);
            asStack_4b8[1].pi_ = (sp_counted_base *)puVar20[7];
            if (uVar18 != uVar29) {
              bVar51 = uVar41 == uVar47;
              do {
                if (bVar51) {
                  if ((uint256 *)local_738._8_8_ == local_728) {
                    std::vector<uint256,std::allocator<uint256>>::_M_realloc_insert<uint256_const&>
                              ((vector<uint256,std::allocator<uint256>> *)local_738,
                               (iterator)local_738._8_8_,(uint256 *)local_4c8);
                  }
                  else {
                    *(sp_counted_base **)
                     ((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 0x10) =
                         asStack_4b8[0].pi_;
                    *(sp_counted_base **)
                     ((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 0x18) =
                         asStack_4b8[1].pi_;
                    *(undefined1 (*) [8])(((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems =
                         local_4c8;
                    *(undefined1 (*) [8])
                     ((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 8) = auStack_4c0;
                    local_738._8_8_ = (uint256 *)(local_738._8_8_ + 0x20);
                  }
                }
                local_4d8 = (undefined1  [16])0x0;
                local_4e8 = (undefined1  [16])0x0;
                local_58 = (undefined1  [16])0x0;
                local_68 = (undefined1  [16])0x0;
                local_78 = (undefined1  [16])0x0;
                local_88 = (undefined1  [16])0x0;
                local_98.pi_ = (sp_counted_base *)0x0;
                puStack_90 = (undefined1 *)0x0;
                local_a8[0] = (class_property<bool>)0x0;
                local_a8._1_7_ = 0;
                abStack_a0[0] = false;
                abStack_a0[1] = false;
                abStack_a0[2] = false;
                abStack_a0[3] = false;
                abStack_a0[4] = false;
                abStack_a0[5] = false;
                abStack_a0[6] = false;
                abStack_a0[7] = false;
                local_48 = 0;
                CSHA256::CSHA256((CSHA256 *)local_a8);
                CSHA256::Write((CSHA256 *)local_a8,local_4c8,0x20);
                CSHA256::Write((CSHA256 *)local_a8,local_4c8,0x20);
                output_01.m_size = 0x20;
                output_01.m_data = local_4e8;
                CHash256::Finalize((CHash256 *)local_a8,output_01);
                local_4c8 = (undefined1  [8])local_4e8._0_8_;
                asStack_4b8[0].pi_ = (sp_counted_base *)local_4d8._0_8_;
                auStack_4c0 = (undefined1  [8])local_4e8._8_8_;
                asStack_4b8[1].pi_ = (sp_counted_base *)local_4d8._8_8_;
                uVar46 = (int)uVar27 + uVar29;
                uVar27 = (ulong)uVar46;
                uVar18 = uVar47 + 1;
                if ((uVar46 >> (uVar18 & 0x1f) & 1) == 0) {
                  puVar34 = (uint256 *)(local_4a8 + (long)(int)uVar18 * 0x20);
                  uVar47 = uVar47 + 2;
                  lVar37 = 0;
                  do {
                    if (bVar51) {
                      if ((uint256 *)local_738._8_8_ == local_728) {
                        std::vector<uint256,std::allocator<uint256>>::
                        _M_realloc_insert<uint256_const&>
                                  ((vector<uint256,std::allocator<uint256>> *)local_738,
                                   (iterator)local_738._8_8_,puVar34);
                      }
                      else {
                        uVar8 = *(undefined8 *)(puVar34->super_base_blob<256U>).m_data._M_elems;
                        uVar9 = *(undefined8 *)
                                 ((puVar34->super_base_blob<256U>).m_data._M_elems + 8);
                        uVar10 = *(undefined8 *)
                                  ((puVar34->super_base_blob<256U>).m_data._M_elems + 0x18);
                        *(undefined8 *)
                         ((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 0x10) =
                             *(undefined8 *)
                              ((puVar34->super_base_blob<256U>).m_data._M_elems + 0x10);
                        *(undefined8 *)
                         ((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 0x18) = uVar10;
                        *(undefined8 *)(((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems =
                             uVar8;
                        *(undefined8 *)((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 8)
                             = uVar9;
LAB_0043e41a:
                        local_738._8_8_ = (uint256 *)(local_738._8_8_ + 0x20);
                      }
                    }
                    else if ((long)(int)uVar18 - (long)(int)uVar41 == lVar37) {
                      if ((uint256 *)local_738._8_8_ != local_728) {
                        *(sp_counted_base **)
                         ((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 0x10) =
                             asStack_4b8[0].pi_;
                        *(sp_counted_base **)
                         ((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 0x18) =
                             asStack_4b8[1].pi_;
                        *(undefined1 (*) [8])(((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems
                             = local_4c8;
                        *(undefined1 (*) [8])
                         ((((base_blob<256U> *)local_738._8_8_)->m_data)._M_elems + 8) = auStack_4c0
                        ;
                        bVar51 = true;
                        goto LAB_0043e41a;
                      }
                      bVar51 = true;
                      std::vector<uint256,std::allocator<uint256>>::
                      _M_realloc_insert<uint256_const&>
                                ((vector<uint256,std::allocator<uint256>> *)local_738,
                                 (iterator)local_738._8_8_,(uint256 *)local_4c8);
                    }
                    local_4d8 = (undefined1  [16])0x0;
                    local_4e8 = (undefined1  [16])0x0;
                    local_58 = (undefined1  [16])0x0;
                    local_68 = (undefined1  [16])0x0;
                    local_78 = (undefined1  [16])0x0;
                    local_88 = (undefined1  [16])0x0;
                    local_98.pi_ = (sp_counted_base *)0x0;
                    puStack_90 = (undefined1 *)0x0;
                    local_a8[0] = (class_property<bool>)0x0;
                    local_a8._1_7_ = 0;
                    abStack_a0[0] = false;
                    abStack_a0[1] = false;
                    abStack_a0[2] = false;
                    abStack_a0[3] = false;
                    abStack_a0[4] = false;
                    abStack_a0[5] = false;
                    abStack_a0[6] = false;
                    abStack_a0[7] = false;
                    local_48 = 0;
                    CSHA256::CSHA256((CSHA256 *)local_a8);
                    CSHA256::Write((CSHA256 *)local_a8,(uchar *)puVar34,0x20);
                    CSHA256::Write((CSHA256 *)local_a8,local_4c8,0x20);
                    output_02.m_size = 0x20;
                    output_02.m_data = local_4e8;
                    CHash256::Finalize((CHash256 *)local_a8,output_02);
                    local_4c8 = (undefined1  [8])local_4e8._0_8_;
                    asStack_4b8[1].pi_ = (sp_counted_base *)local_4d8._8_8_;
                    asStack_4b8[0].pi_ = (sp_counted_base *)local_4d8._0_8_;
                    auStack_4c0 = (undefined1  [8])local_4e8._8_8_;
                    puVar34 = puVar34 + 1;
                    lVar37 = lVar37 + -1;
                    uVar29 = uVar47 & 0x1f;
                    uVar47 = uVar47 + 1;
                  } while ((uVar46 >> uVar29 & 1) == 0);
                  uVar18 = uVar18 - (int)lVar37;
                }
                uVar47 = uVar18;
                uVar29 = 1 << ((byte)uVar47 & 0x1f);
              } while (uVar46 != uVar29);
            }
          }
          pvVar11 = (void *)CONCAT71(local_5d8._1_7_,
                                     local_5d8.p_predicate_value.super_readonly_property<bool>.
                                     super_class_property<bool>.value);
          if (pvVar11 != (void *)0x0) {
            operator_delete(pvVar11,(long)local_5d8.m_message.pn.pi_ - (long)pvVar11);
          }
          local_4e8 = (undefined1  [16])0x0;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = local_4d8._8_8_;
          local_4d8 = auVar13 << 0x40;
          uVar27 = (ulong)(local_508._8_8_ - local_508._0_8_) >> 4;
          if (1 < (int)uVar27) {
            iVar17 = 0;
            uVar41 = uVar40;
            do {
              uVar47 = (uint)uVar27;
              uVar18 = uVar41 ^ 1;
              if ((int)(uVar47 - 1) < (int)(uVar41 ^ 1)) {
                uVar18 = uVar47 - 1;
              }
              puVar34 = local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start + (int)(uVar18 + iVar17);
              if (local_4e8._8_8_ == local_4d8._0_8_) {
                std::vector<uint256,std::allocator<uint256>>::_M_realloc_insert<uint256_const&>
                          ((vector<uint256,std::allocator<uint256>> *)local_4e8,
                           (iterator)local_4e8._8_8_,puVar34);
              }
              else {
                uVar8 = *(undefined8 *)(puVar34->super_base_blob<256U>).m_data._M_elems;
                uVar9 = *(undefined8 *)((puVar34->super_base_blob<256U>).m_data._M_elems + 8);
                uVar10 = *(undefined8 *)((puVar34->super_base_blob<256U>).m_data._M_elems + 0x18);
                *(undefined8 *)((((base_blob<256U> *)local_4e8._8_8_)->m_data)._M_elems + 0x10) =
                     *(undefined8 *)((puVar34->super_base_blob<256U>).m_data._M_elems + 0x10);
                *(undefined8 *)((((base_blob<256U> *)local_4e8._8_8_)->m_data)._M_elems + 0x18) =
                     uVar10;
                *(undefined8 *)(((base_blob<256U> *)local_4e8._8_8_)->m_data)._M_elems = uVar8;
                *(undefined8 *)((((base_blob<256U> *)local_4e8._8_8_)->m_data)._M_elems + 8) = uVar9
                ;
                local_4e8._8_8_ = (uint256 *)(local_4e8._8_8_ + 0x20);
              }
              uVar41 = (int)uVar41 >> 1;
              iVar17 = iVar17 + uVar47;
              uVar27 = (ulong)(uVar47 + 1 >> 1);
            } while (2 < uVar47);
          }
          local_748 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
          ;
          local_740 = "";
          local_758 = &boost::unit_test::basic_cstring<char_const>::null;
          local_750 = &boost::unit_test::basic_cstring<char_const>::null;
          file_05.m_end = (iterator)0xf4;
          file_05.m_begin = (iterator)&local_748;
          msg_05.m_end = pvVar42;
          msg_05.m_begin = pvVar43;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,
                     (size_t)&local_758,msg_05);
          if (local_4e8._8_8_ - local_4e8._0_8_ == local_738._8_8_ - local_738._0_8_) {
            local_a8[0] = (class_property<bool>)(local_4e8._0_8_ == local_4e8._8_8_);
            if (!(bool)local_a8[0]) {
              auVar64[0] = -(*(char *)local_738._0_8_ == *(char *)local_4e8._0_8_);
              auVar64[1] = -(*(char *)(local_738._0_8_ + 1) == *(char *)(local_4e8._0_8_ + 1));
              auVar64[2] = -(*(char *)(local_738._0_8_ + 2) == *(char *)(local_4e8._0_8_ + 2));
              auVar64[3] = -(*(char *)(local_738._0_8_ + 3) == *(char *)(local_4e8._0_8_ + 3));
              auVar64[4] = -(*(char *)(local_738._0_8_ + 4) == *(char *)(local_4e8._0_8_ + 4));
              auVar64[5] = -(*(char *)(local_738._0_8_ + 5) == *(char *)(local_4e8._0_8_ + 5));
              auVar64[6] = -(*(char *)(local_738._0_8_ + 6) == *(char *)(local_4e8._0_8_ + 6));
              auVar64[7] = -(*(char *)(local_738._0_8_ + 7) == *(char *)(local_4e8._0_8_ + 7));
              auVar64[8] = -(*(char *)(local_738._0_8_ + 8) == *(char *)(local_4e8._0_8_ + 8));
              auVar64[9] = -(*(char *)(local_738._0_8_ + 9) == *(char *)(local_4e8._0_8_ + 9));
              auVar64[10] = -(*(char *)(local_738._0_8_ + 10) == *(char *)(local_4e8._0_8_ + 10));
              auVar64[0xb] = -(*(char *)(local_738._0_8_ + 0xb) == *(char *)(local_4e8._0_8_ + 0xb))
              ;
              auVar64[0xc] = -(*(char *)(local_738._0_8_ + 0xc) == *(char *)(local_4e8._0_8_ + 0xc))
              ;
              auVar64[0xd] = -(*(char *)(local_738._0_8_ + 0xd) == *(char *)(local_4e8._0_8_ + 0xd))
              ;
              auVar64[0xe] = -(*(char *)(local_738._0_8_ + 0xe) == *(char *)(local_4e8._0_8_ + 0xe))
              ;
              auVar64[0xf] = -(*(char *)(local_738._0_8_ + 0xf) == *(char *)(local_4e8._0_8_ + 0xf))
              ;
              auVar55[0] = -(*(char *)(local_738._0_8_ + 0x10) == *(char *)(local_4e8._0_8_ + 0x10))
              ;
              auVar55[1] = -(*(char *)(local_738._0_8_ + 0x11) == *(char *)(local_4e8._0_8_ + 0x11))
              ;
              auVar55[2] = -(*(char *)(local_738._0_8_ + 0x12) == *(char *)(local_4e8._0_8_ + 0x12))
              ;
              auVar55[3] = -(*(char *)(local_738._0_8_ + 0x13) == *(char *)(local_4e8._0_8_ + 0x13))
              ;
              auVar55[4] = -(*(char *)(local_738._0_8_ + 0x14) == *(char *)(local_4e8._0_8_ + 0x14))
              ;
              auVar55[5] = -(*(char *)(local_738._0_8_ + 0x15) == *(char *)(local_4e8._0_8_ + 0x15))
              ;
              auVar55[6] = -(*(char *)(local_738._0_8_ + 0x16) == *(char *)(local_4e8._0_8_ + 0x16))
              ;
              auVar55[7] = -(*(char *)(local_738._0_8_ + 0x17) == *(char *)(local_4e8._0_8_ + 0x17))
              ;
              auVar55[8] = -(*(char *)(local_738._0_8_ + 0x18) == *(char *)(local_4e8._0_8_ + 0x18))
              ;
              auVar55[9] = -(*(char *)(local_738._0_8_ + 0x19) == *(char *)(local_4e8._0_8_ + 0x19))
              ;
              auVar55[10] = -(*(char *)(local_738._0_8_ + 0x1a) == *(char *)(local_4e8._0_8_ + 0x1a)
                             );
              auVar55[0xb] = -(*(char *)(local_738._0_8_ + 0x1b) ==
                              *(char *)(local_4e8._0_8_ + 0x1b));
              auVar55[0xc] = -(*(char *)(local_738._0_8_ + 0x1c) ==
                              *(char *)(local_4e8._0_8_ + 0x1c));
              auVar55[0xd] = -(*(char *)(local_738._0_8_ + 0x1d) ==
                              *(char *)(local_4e8._0_8_ + 0x1d));
              auVar55[0xe] = -(*(char *)(local_738._0_8_ + 0x1e) ==
                              *(char *)(local_4e8._0_8_ + 0x1e));
              auVar55[0xf] = -(*(char *)(local_738._0_8_ + 0x1f) ==
                              *(char *)(local_4e8._0_8_ + 0x1f));
              auVar55 = auVar55 & auVar64;
              uVar7 = (ushort)(SUB161(auVar55 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar55 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar55 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar55 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar55 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar55 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar55 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar55 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar55 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar55 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar55 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar55 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar55 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar55 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar55 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar55[0xf] >> 7) << 0xf;
              pcVar14 = (char *)local_4e8._0_8_;
              pcVar15 = (char *)local_738._0_8_;
              while (uVar7 == 0xffff) {
                pcVar21 = pcVar14 + 0x20;
                local_a8[0] = (class_property<bool>)(pcVar21 == (char *)local_4e8._8_8_);
                if ((bool)local_a8[0]) goto LAB_0043e733;
                auVar65[0] = -(pcVar15[0x20] == *pcVar21);
                auVar65[1] = -(pcVar15[0x21] == pcVar14[0x21]);
                auVar65[2] = -(pcVar15[0x22] == pcVar14[0x22]);
                auVar65[3] = -(pcVar15[0x23] == pcVar14[0x23]);
                auVar65[4] = -(pcVar15[0x24] == pcVar14[0x24]);
                auVar65[5] = -(pcVar15[0x25] == pcVar14[0x25]);
                auVar65[6] = -(pcVar15[0x26] == pcVar14[0x26]);
                auVar65[7] = -(pcVar15[0x27] == pcVar14[0x27]);
                auVar65[8] = -(pcVar15[0x28] == pcVar14[0x28]);
                auVar65[9] = -(pcVar15[0x29] == pcVar14[0x29]);
                auVar65[10] = -(pcVar15[0x2a] == pcVar14[0x2a]);
                auVar65[0xb] = -(pcVar15[0x2b] == pcVar14[0x2b]);
                auVar65[0xc] = -(pcVar15[0x2c] == pcVar14[0x2c]);
                auVar65[0xd] = -(pcVar15[0x2d] == pcVar14[0x2d]);
                auVar65[0xe] = -(pcVar15[0x2e] == pcVar14[0x2e]);
                auVar65[0xf] = -(pcVar15[0x2f] == pcVar14[0x2f]);
                auVar56[0] = -(pcVar15[0x30] == pcVar14[0x30]);
                auVar56[1] = -(pcVar15[0x31] == pcVar14[0x31]);
                auVar56[2] = -(pcVar15[0x32] == pcVar14[0x32]);
                auVar56[3] = -(pcVar15[0x33] == pcVar14[0x33]);
                auVar56[4] = -(pcVar15[0x34] == pcVar14[0x34]);
                auVar56[5] = -(pcVar15[0x35] == pcVar14[0x35]);
                auVar56[6] = -(pcVar15[0x36] == pcVar14[0x36]);
                auVar56[7] = -(pcVar15[0x37] == pcVar14[0x37]);
                auVar56[8] = -(pcVar15[0x38] == pcVar14[0x38]);
                auVar56[9] = -(pcVar15[0x39] == pcVar14[0x39]);
                auVar56[10] = -(pcVar15[0x3a] == pcVar14[0x3a]);
                auVar56[0xb] = -(pcVar15[0x3b] == pcVar14[0x3b]);
                auVar56[0xc] = -(pcVar15[0x3c] == pcVar14[0x3c]);
                auVar56[0xd] = -(pcVar15[0x3d] == pcVar14[0x3d]);
                auVar56[0xe] = -(pcVar15[0x3e] == pcVar14[0x3e]);
                auVar56[0xf] = -(pcVar15[0x3f] == pcVar14[0x3f]);
                auVar56 = auVar56 & auVar65;
                pcVar14 = pcVar21;
                pcVar15 = pcVar15 + 0x20;
                uVar7 = (ushort)(SUB161(auVar56 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar56 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar56 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar56 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar56 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar56 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar56 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar56 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar56 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar56 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar56 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar56 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar56 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar56 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar56 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar56[0xf] >> 7) << 0xf;
              }
              goto LAB_0043e731;
            }
          }
          else {
LAB_0043e731:
            local_a8[0] = (class_property<bool>)false;
          }
LAB_0043e733:
          abStack_a0[0] = false;
          abStack_a0[1] = false;
          abStack_a0[2] = false;
          abStack_a0[3] = false;
          abStack_a0[4] = false;
          abStack_a0[5] = false;
          abStack_a0[6] = false;
          abStack_a0[7] = false;
          local_98.pi_ = (sp_counted_base *)0x0;
          local_4c8 = (undefined1  [8])0xecdad3;
          auStack_4c0 = (undefined1  [8])0xecdae9;
          local_4a8[8] = 0;
          local_4a8._0_8_ = &PTR__lazy_ostream_013d3df0;
          auStack_490._0_8_ = local_4c8;
          local_498 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
          local_768 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
          ;
          local_760 = "";
          pvVar43 = (iterator)0x1;
          pvVar42 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_a8,(lazy_ostream *)local_4a8,1,0,WARN,_cVar66,
                     (size_t)&local_768,0xf4);
          boost::detail::shared_count::~shared_count(&local_98);
          local_778 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
          ;
          local_770 = "";
          local_788 = &boost::unit_test::basic_cstring<char_const>::null;
          local_780 = &boost::unit_test::basic_cstring<char_const>::null;
          file_06.m_end = (iterator)0xf5;
          file_06.m_begin = (iterator)&local_778;
          msg_06.m_end = pvVar42;
          msg_06.m_begin = pvVar43;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                     (size_t)&local_788,msg_06);
          peVar6 = (((pointer)(local_508._0_8_ + (long)(int)uVar40 * 0x10))->
                   super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_4c8 = *(undefined1 (*) [8])
                       (peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems;
          _auStack_4c0 = *(undefined1 (*) [16])
                          ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 8)
          ;
          asStack_4b8[1].pi_ =
               *(sp_counted_base **)
                ((long)(peVar6->hash).m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18);
          for (puVar35 = (uchar *)local_738._0_8_; puVar35 != (uchar *)local_738._8_8_;
              puVar35 = puVar35 + 0x20) {
            if ((uVar40 & 1) == 0) {
              local_98.pi_ = (sp_counted_base *)0x0;
              puStack_90 = (undefined1 *)0x0;
              local_a8[0] = (class_property<bool>)0x0;
              local_a8._1_7_ = 0;
              abStack_a0[0] = false;
              abStack_a0[1] = false;
              abStack_a0[2] = false;
              abStack_a0[3] = false;
              abStack_a0[4] = false;
              abStack_a0[5] = false;
              abStack_a0[6] = false;
              abStack_a0[7] = false;
              local_458 = (undefined1  [16])0x0;
              local_468 = (undefined1  [16])0x0;
              local_478 = (undefined1  [16])0x0;
              auStack_490._8_16_ = (undefined1  [16])0x0;
              _local_498 = (undefined1  [16])0x0;
              local_4a8._0_8_ = (_func_int **)0x0;
              local_4a8[8] = false;
              local_4a8._9_7_ = 0;
              local_448 = 0;
              CSHA256::CSHA256((CSHA256 *)local_4a8);
              CSHA256::Write((CSHA256 *)local_4a8,local_4c8,0x20);
              CSHA256::Write((CSHA256 *)local_4a8,puVar35,0x20);
              output_03.m_size = 0x20;
              output_03.m_data = local_a8;
              CHash256::Finalize((CHash256 *)local_4a8,output_03);
            }
            else {
              local_98.pi_ = (sp_counted_base *)0x0;
              puStack_90 = (undefined1 *)0x0;
              local_a8[0] = (class_property<bool>)0x0;
              local_a8._1_7_ = 0;
              abStack_a0[0] = false;
              abStack_a0[1] = false;
              abStack_a0[2] = false;
              abStack_a0[3] = false;
              abStack_a0[4] = false;
              abStack_a0[5] = false;
              abStack_a0[6] = false;
              abStack_a0[7] = false;
              local_458 = (undefined1  [16])0x0;
              local_468 = (undefined1  [16])0x0;
              local_478 = (undefined1  [16])0x0;
              auStack_490._8_16_ = (undefined1  [16])0x0;
              _local_498 = (undefined1  [16])0x0;
              local_4a8._0_8_ = (_func_int **)0x0;
              local_4a8[8] = false;
              local_4a8._9_7_ = 0;
              local_448 = 0;
              CSHA256::CSHA256((CSHA256 *)local_4a8);
              CSHA256::Write((CSHA256 *)local_4a8,puVar35,0x20);
              CSHA256::Write((CSHA256 *)local_4a8,local_4c8,0x20);
              output_04.m_size = 0x20;
              output_04.m_data = local_a8;
              CHash256::Finalize((CHash256 *)local_4a8,output_04);
            }
            local_4c8 = (undefined1  [8])CONCAT71(local_a8._1_7_,local_a8[0]);
            auStack_4c0[1] = abStack_a0[1];
            auStack_4c0[2] = abStack_a0[2];
            auStack_4c0[3] = abStack_a0[3];
            auStack_4c0[4] = abStack_a0[4];
            auStack_4c0[5] = abStack_a0[5];
            auStack_4c0[6] = abStack_a0[6];
            auStack_4c0[7] = abStack_a0[7];
            auStack_4c0[0] = abStack_a0[0];
            asStack_4b8[0].pi_ = local_98.pi_;
            asStack_4b8[1].pi_ = (sp_counted_base *)puStack_90;
            uVar40 = uVar40 >> 1;
          }
          auVar61[0] = -(asStack_4b8[0].pi_._0_1_ == local_588[0]);
          auVar61[1] = -(asStack_4b8[0].pi_._1_1_ == local_588[1]);
          auVar61[2] = -(asStack_4b8[0].pi_._2_1_ == local_588[2]);
          auVar61[3] = -(asStack_4b8[0].pi_._3_1_ == local_588[3]);
          auVar61[4] = -(asStack_4b8[0].pi_._4_1_ == local_588[4]);
          auVar61[5] = -(asStack_4b8[0].pi_._5_1_ == local_588[5]);
          auVar61[6] = -(asStack_4b8[0].pi_._6_1_ == local_588[6]);
          auVar61[7] = -(asStack_4b8[0].pi_._7_1_ == local_588[7]);
          auVar61[8] = -(asStack_4b8[1].pi_._0_1_ == local_588[8]);
          auVar61[9] = -(asStack_4b8[1].pi_._1_1_ == local_588[9]);
          auVar61[10] = -(asStack_4b8[1].pi_._2_1_ == local_588[10]);
          auVar61[0xb] = -(asStack_4b8[1].pi_._3_1_ == local_588[0xb]);
          auVar61[0xc] = -(asStack_4b8[1].pi_._4_1_ == local_588[0xc]);
          auVar61[0xd] = -(asStack_4b8[1].pi_._5_1_ == local_588[0xd]);
          auVar61[0xe] = -(asStack_4b8[1].pi_._6_1_ == local_588[0xe]);
          auVar61[0xf] = -(asStack_4b8[1].pi_._7_1_ == local_588[0xf]);
          auVar57[0] = -(local_4c8[0] == (readonly_property<bool>)local_598._0_1_);
          auVar57[1] = -(local_4c8[1] == local_598._1_1_);
          auVar57[2] = -(local_4c8[2] == local_598._2_1_);
          auVar57[3] = -(local_4c8[3] == local_598._3_1_);
          auVar57[4] = -(local_4c8[4] == local_598._4_1_);
          auVar57[5] = -(local_4c8[5] == local_598._5_1_);
          auVar57[6] = -(local_4c8[6] == local_598._6_1_);
          auVar57[7] = -(local_4c8[7] == local_598._7_1_);
          auVar57[8] = -(auStack_4c0[0] == (uchar)uStack_590);
          auVar57[9] = -(auStack_4c0[1] == uStack_590._1_1_);
          auVar57[10] = -(auStack_4c0[2] == uStack_590._2_1_);
          auVar57[0xb] = -(auStack_4c0[3] == uStack_590._3_1_);
          auVar57[0xc] = -(auStack_4c0[4] == uStack_590._4_1_);
          auVar57[0xd] = -(auStack_4c0[5] == uStack_590._5_1_);
          auVar57[0xe] = -(auStack_4c0[6] == uStack_590._6_1_);
          auVar57[0xf] = -(auStack_4c0[7] == uStack_590._7_1_);
          auVar57 = auVar57 & auVar61;
          local_5d8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value
               = (readonly_property<bool>)
                 ((ushort)((ushort)(SUB161(auVar57 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar57 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar57 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar57 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar57 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar57 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar57 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar57 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar57 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar57 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar57 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar57 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar57 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar57 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar57 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar57[0xf] >> 7) << 0xf) == 0xffff);
          local_5d8.m_message.px = (element_type *)0x0;
          local_5d8.m_message.pn.pi_ = (sp_counted_base *)0x0;
          local_a8[0] = (class_property<bool>)0xea;
          local_a8._1_7_ = 0xecda;
          abStack_a0[0] = true;
          abStack_a0[1] = true;
          abStack_a0[2] = true;
          abStack_a0[3] = false;
          abStack_a0[4] = false;
          abStack_a0[5] = false;
          abStack_a0[6] = false;
          abStack_a0[7] = false;
          local_4a8[8] = 0;
          local_4a8._0_8_ = &PTR__lazy_ostream_013d3df0;
          auStack_490._0_8_ = local_a8;
          local_498 = (undefined1  [8])boost::unit_test::lazy_ostream::inst;
          local_798 = 
          "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/merkle_tests.cpp"
          ;
          local_790 = "";
          pvVar43 = (iterator)0x1;
          pvVar42 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    (&local_5d8,(lazy_ostream *)local_4a8,1,0,WARN,_cVar66,(size_t)&local_798,0xf5);
          boost::detail::shared_count::~shared_count(&local_5d8.m_message.pn);
          if ((void *)local_4e8._0_8_ != (void *)0x0) {
            operator_delete((void *)local_4e8._0_8_,local_4d8._0_8_ - local_4e8._0_8_);
          }
          if ((void *)local_738._0_8_ != (void *)0x0) {
            operator_delete((void *)local_738._0_8_,(long)local_728 - local_738._0_8_);
          }
          uVar49 = uVar49 + 1;
        } while (uVar49 != uVar23);
      }
      if (local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_628.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_628.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_628.super__Vector_base<uint256,_std::allocator<uint256>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)local_508);
      uVar39 = uVar39 + 1;
    } while (uVar39 != 4);
    uVar36 = uVar36 + 1;
    if (uVar36 == 0x20) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

BOOST_AUTO_TEST_CASE(merkle_test)
{
    for (int i = 0; i < 32; i++) {
        // Try 32 block sizes: all sizes from 0 to 16 inclusive, and then 15 random sizes.
        int ntx = (i <= 16) ? i : 17 + (m_rng.randrange(4000));
        // Try up to 3 mutations.
        for (int mutate = 0; mutate <= 3; mutate++) {
            int duplicate1 = mutate >= 1 ? 1 << ctz(ntx) : 0; // The last how many transactions to duplicate first.
            if (duplicate1 >= ntx) break; // Duplication of the entire tree results in a different root (it adds a level).
            int ntx1 = ntx + duplicate1; // The resulting number of transactions after the first duplication.
            int duplicate2 = mutate >= 2 ? 1 << ctz(ntx1) : 0; // Likewise for the second mutation.
            if (duplicate2 >= ntx1) break;
            int ntx2 = ntx1 + duplicate2;
            int duplicate3 = mutate >= 3 ? 1 << ctz(ntx2) : 0; // And for the third mutation.
            if (duplicate3 >= ntx2) break;
            int ntx3 = ntx2 + duplicate3;
            // Build a block with ntx different transactions.
            CBlock block;
            block.vtx.resize(ntx);
            for (int j = 0; j < ntx; j++) {
                CMutableTransaction mtx;
                mtx.nLockTime = j;
                block.vtx[j] = MakeTransactionRef(std::move(mtx));
            }
            // Compute the root of the block before mutating it.
            bool unmutatedMutated = false;
            uint256 unmutatedRoot = BlockMerkleRoot(block, &unmutatedMutated);
            BOOST_CHECK(unmutatedMutated == false);
            // Optionally mutate by duplicating the last transactions, resulting in the same merkle root.
            block.vtx.resize(ntx3);
            for (int j = 0; j < duplicate1; j++) {
                block.vtx[ntx + j] = block.vtx[ntx + j - duplicate1];
            }
            for (int j = 0; j < duplicate2; j++) {
                block.vtx[ntx1 + j] = block.vtx[ntx1 + j - duplicate2];
            }
            for (int j = 0; j < duplicate3; j++) {
                block.vtx[ntx2 + j] = block.vtx[ntx2 + j - duplicate3];
            }
            // Compute the merkle root and merkle tree using the old mechanism.
            bool oldMutated = false;
            std::vector<uint256> merkleTree;
            uint256 oldRoot = BlockBuildMerkleTree(block, &oldMutated, merkleTree);
            // Compute the merkle root using the new mechanism.
            bool newMutated = false;
            uint256 newRoot = BlockMerkleRoot(block, &newMutated);
            BOOST_CHECK(oldRoot == newRoot);
            BOOST_CHECK(newRoot == unmutatedRoot);
            BOOST_CHECK((newRoot == uint256()) == (ntx == 0));
            BOOST_CHECK(oldMutated == newMutated);
            BOOST_CHECK(newMutated == !!mutate);
            // If no mutation was done (once for every ntx value), try up to 16 branches.
            if (mutate == 0) {
                for (int loop = 0; loop < std::min(ntx, 16); loop++) {
                    // If ntx <= 16, try all branches. Otherwise, try 16 random ones.
                    int mtx = loop;
                    if (ntx > 16) {
                        mtx = m_rng.randrange(ntx);
                    }
                    std::vector<uint256> newBranch = BlockMerkleBranch(block, mtx);
                    std::vector<uint256> oldBranch = BlockGetMerkleBranch(block, merkleTree, mtx);
                    BOOST_CHECK(oldBranch == newBranch);
                    BOOST_CHECK(ComputeMerkleRootFromBranch(block.vtx[mtx]->GetHash(), newBranch, mtx) == oldRoot);
                }
            }
        }
    }
}